

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ScriptBlock.cpp
# Opt level: O0

Object * __thiscall ScriptBlock::execute(ScriptBlock *this,Engine *engine)

{
  LocalFunction *this_00;
  uint localFunctionName;
  LocalFunction *function;
  uint i;
  Engine *engine_local;
  ScriptBlock *this_local;
  
  if ((this->isRoot & 1U) != 0) {
    for (function._4_4_ = 0; function._4_4_ < this->functionsCount;
        function._4_4_ = function._4_4_ + 1) {
      this_00 = this->functions[function._4_4_];
      localFunctionName = LocalFunction::getName(this_00);
      Engine::setLocalFunction(engine,localFunctionName,this_00);
    }
  }
  for (function._4_4_ = 0; function._4_4_ < this->commandsCount; function._4_4_ = function._4_4_ + 1
      ) {
    executeVoid(this->commands[function._4_4_],engine);
  }
  return (Object *)0x0;
}

Assistant:

Object *ScriptBlock::execute(Engine *engine) {
	unsigned int i;
	if (this->isRoot) {
		for (i = 0; i < this->functionsCount; i++) {
			LocalFunction* function = this->functions[i];
			engine->setLocalFunction(function->getName(), function);
		}
	}
	
	for (i = 0; i < this->commandsCount; i++) {
		executeVoid(this->commands[i], engine);
	}
	return nullptr;
}